

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KCPSocket.cpp
# Opt level: O2

void __thiscall net_uv::KCPSocket::~KCPSocket(KCPSocket *this)

{
  (this->super_Socket)._vptr_Socket = (_func_int **)&PTR__KCPSocket_0017a2f8;
  if (this->m_socketAddr != (sockaddr *)0x0) {
    free(this->m_socketAddr);
    this->m_socketAddr = (sockaddr *)0x0;
  }
  if (this->m_recvBuf != (char *)0x0) {
    free(this->m_recvBuf);
    this->m_recvBuf = (char *)0x0;
  }
  if (this->m_udp == (uv_udp_t *)0x0) {
    if ((this->m_socketMng != (KCPSocketManager *)0x0) && (this->m_weakRefTag == false)) {
      (**this->m_socketMng->_vptr_KCPSocketManager)();
      free(this->m_socketMng);
      this->m_socketMng = (KCPSocketManager *)0x0;
    }
    std::_Function_base::~_Function_base(&(this->m_connectFilterCall).super__Function_base);
    std::_Function_base::~_Function_base(&(this->m_newConnectionCall).super__Function_base);
    Socket::~Socket(&this->super_Socket);
    return;
  }
  __assert_fail("m_udp == NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/tkzcfc[P]vpn_uv/ThirdParty/net_uv/kcp/KCPSocket.cpp"
                ,0x21,"virtual net_uv::KCPSocket::~KCPSocket()");
}

Assistant:

KCPSocket::~KCPSocket()
{
	FC_SAFE_FREE(m_socketAddr);
	FC_SAFE_FREE(m_recvBuf);

	assert(m_udp == NULL);

	if (m_socketMng != NULL && !m_weakRefTag)
	{
		m_socketMng->~KCPSocketManager();
		fc_free(m_socketMng);
		m_socketMng = NULL;
	}
}